

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRFormatInformation.h
# Opt level: O2

Type __thiscall ZXing::QRCode::FormatInformation::type(FormatInformation *this)

{
  uint32_t uVar1;
  Type TVar2;
  
  uVar1 = this->mask;
  if (uVar1 != 0x2825) {
    if ((uVar1 == 0x20a7b) || (uVar1 == 0x1fab2)) {
      TVar2 = rMQR;
    }
    else if (uVar1 == 0x4445) {
      TVar2 = Micro;
    }
    else {
      TVar2 = Model2;
    }
    return TVar2;
  }
  return Model1;
}

Assistant:

Type type() const
	{
		switch (mask) {
		case FORMAT_INFO_MASK_MODEL1: return Type::Model1;
		case FORMAT_INFO_MASK_MICRO: return Type::Micro;
		case FORMAT_INFO_MASK_RMQR: [[fallthrough]];
		case FORMAT_INFO_MASK_RMQR_SUB: return Type::rMQR;
		default: return Type::Model2;
		}
	}